

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chain_matrix.h
# Opt level: O1

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
Gudhi::persistence_matrix::
Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>
::_reduce_boundary<std::vector<unsigned_int,std::allocator<unsigned_int>>>
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>
          *this,ID_index cellID,vector<unsigned_int,_std::allocator<unsigned_int>_> *boundary,
          Dimension dim)

{
  vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>>>
  *this_00;
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>
  *targetColumn;
  uint uVar1;
  ID_index IVar2;
  Dimension DVar3;
  uint uVar4;
  undefined4 uVar5;
  pointer puVar6;
  pointer puVar7;
  iterator __position;
  bool bVar8;
  long lVar9;
  long lVar10;
  mapped_type *__args;
  _List_node_base *p_Var11;
  Column *col;
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>
  *source;
  pointer p_1;
  undefined8 *puVar12;
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>
  *pCVar13;
  pointer p_3;
  undefined8 *puVar14;
  pointer p;
  uint *puVar15;
  pair<std::_Rb_tree_iterator<unsigned_int>,_bool> pVar16;
  vector<unsigned_int,_std::allocator<unsigned_int>_> chainsInH;
  Tmp_column column;
  _List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_> local_b0;
  uint local_a8;
  int local_a4;
  uint local_a0;
  anon_class_1_0_00000001 local_9b;
  anon_class_1_0_00000001 local_9a;
  anon_class_1_0_00000001 local_99;
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>
  *local_98;
  vector<unsigned_int,std::allocator<unsigned_int>> *local_90;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_88;
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>
  *local_68;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_60;
  
  local_a0 = cellID;
  std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>::
  set<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            ((set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>> *)&local_60,
             (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )(boundary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )(boundary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_finish);
  if (dim == -1) {
    puVar6 = (boundary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    puVar7 = (boundary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    dim = 0;
    if (puVar6 != puVar7) {
      dim = (int)((ulong)((long)puVar6 - (long)puVar7) >> 2) + -1;
    }
  }
  local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_90 = (vector<unsigned_int,std::allocator<unsigned_int>> *)__return_storage_ptr__;
  if ((boundary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_start ==
      (boundary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    std::
    _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
    ::_M_insert_unique<unsigned_int_const&>
              ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                *)&local_60,&local_a0);
    uVar5 = *(undefined4 *)(this + 0xa8);
    local_b0._M_node._0_4_ = dim;
    lVar9 = std::_Rb_tree_decrement(&local_60._M_impl.super__Rb_tree_header._M_header);
    uVar1 = *(uint *)(lVar9 + 0x20);
    std::
    vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>>>
    ::
    emplace_back<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>const&,int&,Gudhi::persistence_matrix::Matrix<Chain_barcode_options<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>::Column_z2_settings*&>
              ((vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>>>
                *)(this + 0x78),
               (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
               &local_60,(int *)&local_b0,(Column_z2_settings **)(this + 0xb0));
    *(undefined4 *)(*(long *)(this + 0x90) + (ulong)uVar1 * 4) = uVar5;
    p_Var11 = (_List_node_base *)operator_new(0x20);
    pCVar13 = this + 0x70;
    uVar5 = *(undefined4 *)(this + 0x70);
    *(Dimension *)&p_Var11[1]._M_next = dim;
    *(undefined4 *)((long)&p_Var11[1]._M_next + 4) = uVar5;
    *(undefined4 *)&p_Var11[1]._M_prev = 0xffffffff;
    std::__detail::_List_node_base::_M_hook(p_Var11);
    *(long *)(this + 0x30) = *(long *)(this + 0x30) + 1;
    local_b0._M_node = *(_List_node_base **)(this + 0x28);
    std::__detail::
    _Insert_base<unsigned_int,std::pair<unsigned_int_const,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>,std::allocator<std::pair<unsigned_int_const,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::
    try_emplace<unsigned_int_const&,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>&>
              ((_Insert_base<unsigned_int,std::pair<unsigned_int_const,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>,std::allocator<std::pair<unsigned_int_const,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)(this + 0x38),(const_iterator)0x0,(uint *)pCVar13,&local_b0);
LAB_00115b45:
    *(uint *)pCVar13 = *(uint *)pCVar13 + 1;
  }
  else {
    local_a4 = dim;
    lVar9 = std::_Rb_tree_decrement(&local_60._M_impl.super__Rb_tree_header._M_header);
    lVar9 = (ulong)*(uint *)(*(long *)(this + 0x90) + (ulong)*(uint *)(lVar9 + 0x20) * 4) * 0x30;
    local_98 = this;
    if (*(int *)(*(long *)(this + 0x78) + 8 + lVar9) != -1) {
      lVar9 = *(long *)(this + 0x78) + lVar9;
      do {
        for (puVar12 = *(undefined8 **)(lVar9 + 0x20); puVar12 != (undefined8 *)(lVar9 + 0x20);
            puVar12 = (undefined8 *)*puVar12) {
          if (puVar12 == (undefined8 *)0x0) goto LAB_00115b89;
          local_b0._M_node._0_4_ = *(undefined4 *)(puVar12 + 2);
          pVar16 = std::
                   _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                   ::_M_insert_unique<unsigned_int>(&local_60,(uint *)&local_b0);
          if (((undefined1  [16])pVar16 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            std::
            _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
            ::erase_abi_cxx11_((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                                *)&local_60,(_Base_ptr)pVar16.first._M_node);
          }
        }
        local_b0._M_node._0_4_ = *(uint *)(lVar9 + 8);
        if (local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    (&local_88,
                     (iterator)
                     local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_b0);
        }
        else {
          *local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish = *(uint *)(lVar9 + 8);
          local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        if (local_60._M_impl.super__Rb_tree_header._M_node_count == 0) {
          local_a8 = local_a0;
          std::
          _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
          ::_M_insert_unique<unsigned_int_const&>
                    ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                      *)&local_60,&local_a8);
          puVar6 = local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          local_68 = local_98 + 0x78;
          if (local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start !=
              local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            pCVar13 = (Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>
                       *)local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start;
            do {
              puVar14 = (undefined8 *)(*(long *)local_68 + (ulong)*(uint *)pCVar13 * 0x30 + 0x20);
              for (puVar12 = (undefined8 *)*puVar14; puVar12 != puVar14;
                  puVar12 = (undefined8 *)*puVar12) {
                if (puVar12 == (undefined8 *)0x0) goto LAB_00115b89;
                local_b0._M_node._0_4_ = *(undefined4 *)(puVar12 + 2);
                pVar16 = std::
                         _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                         ::_M_insert_unique<unsigned_int>(&local_60,(uint *)&local_b0);
                if (((undefined1  [16])pVar16 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
                  std::
                  _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                  ::erase_abi_cxx11_((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                                      *)&local_60,(_Base_ptr)pVar16.first._M_node);
                }
              }
              pCVar13 = pCVar13 + 4;
            } while (pCVar13 !=
                     (Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>
                      *)puVar6);
          }
          this = local_98;
          uVar5 = *(undefined4 *)(local_98 + 0xa8);
          local_b0._M_node._0_4_ = local_a4;
          lVar9 = std::_Rb_tree_decrement(&local_60._M_impl.super__Rb_tree_header._M_header);
          uVar1 = *(uint *)(lVar9 + 0x20);
          std::
          vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>>>
          ::
          emplace_back<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>const&,int&,Gudhi::persistence_matrix::Matrix<Chain_barcode_options<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>::Column_z2_settings*&>
                    ((vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>>>
                      *)local_68,
                     (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                     &local_60,(int *)&local_b0,(Column_z2_settings **)(this + 0xb0));
          *(undefined4 *)(*(long *)(this + 0x90) + (ulong)uVar1 * 4) = uVar5;
          p_Var11 = (_List_node_base *)operator_new(0x20);
          pCVar13 = this + 0x70;
          uVar5 = *(undefined4 *)(this + 0x70);
          *(int *)&p_Var11[1]._M_next = local_a4;
          *(undefined4 *)((long)&p_Var11[1]._M_next + 4) = uVar5;
          *(undefined4 *)&p_Var11[1]._M_prev = 0xffffffff;
          std::__detail::_List_node_base::_M_hook(p_Var11);
          *(long *)(this + 0x30) = *(long *)(this + 0x30) + 1;
          local_b0._M_node = *(_List_node_base **)(this + 0x28);
          std::__detail::
          _Insert_base<unsigned_int,std::pair<unsigned_int_const,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>,std::allocator<std::pair<unsigned_int_const,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::
          try_emplace<unsigned_int_const&,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>&>
                    ((_Insert_base<unsigned_int,std::pair<unsigned_int_const,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>,std::allocator<std::pair<unsigned_int_const,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)(this + 0x38),(const_iterator)0x0,(uint *)pCVar13,&local_b0);
          goto LAB_00115b45;
        }
        lVar9 = std::_Rb_tree_decrement(&local_60._M_impl.super__Rb_tree_header._M_header);
        lVar10 = (ulong)*(uint *)(*(long *)(local_98 + 0x90) + (ulong)*(uint *)(lVar9 + 0x20) * 4) *
                 0x30;
        lVar9 = *(long *)(local_98 + 0x78) + lVar10;
      } while (*(int *)(*(long *)(local_98 + 0x78) + 8 + lVar10) != -1);
    }
    pCVar13 = local_98;
    if (local_60._M_impl.super__Rb_tree_header._M_node_count != 0) {
      do {
        lVar10 = std::_Rb_tree_decrement(&local_60._M_impl.super__Rb_tree_header._M_header);
        lVar9 = *(long *)(pCVar13 + 0x78);
        uVar1 = *(uint *)(*(long *)(pCVar13 + 0x90) + (ulong)*(uint *)(lVar10 + 0x20) * 4);
        lVar10 = (ulong)uVar1 * 0x30;
        if (*(int *)(lVar9 + 8 + lVar10) == -1) {
          puVar14 = (undefined8 *)(lVar9 + lVar10 + 0x20);
          local_a8 = uVar1;
          for (puVar12 = (undefined8 *)*puVar14; puVar12 != puVar14;
              puVar12 = (undefined8 *)*puVar12) {
            if (puVar12 == (undefined8 *)0x0) goto LAB_00115b89;
            local_b0._M_node._0_4_ = *(undefined4 *)(puVar12 + 2);
            pVar16 = std::
                     _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                     ::_M_insert_unique<unsigned_int>(&local_60,(uint *)&local_b0);
            if (((undefined1  [16])pVar16 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
              std::
              _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
              ::erase_abi_cxx11_((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                                  *)&local_60,(_Base_ptr)pVar16.first._M_node);
            }
          }
          __position._M_current = *(uint **)(local_90 + 8);
          if (__position._M_current == *(uint **)(local_90 + 0x10)) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>(local_90,__position,&local_a8);
          }
          else {
            *__position._M_current = local_a8;
            *(uint **)(local_90 + 8) = __position._M_current + 1;
          }
        }
        else {
          lVar9 = lVar9 + lVar10;
          for (puVar12 = *(undefined8 **)(lVar9 + 0x20); puVar12 != (undefined8 *)(lVar9 + 0x20);
              puVar12 = (undefined8 *)*puVar12) {
            if (puVar12 == (undefined8 *)0x0) goto LAB_00115b89;
            local_b0._M_node._0_4_ = *(undefined4 *)(puVar12 + 2);
            pVar16 = std::
                     _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                     ::_M_insert_unique<unsigned_int>(&local_60,(uint *)&local_b0);
            if (((undefined1  [16])pVar16 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
              std::
              _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
              ::erase_abi_cxx11_((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                                  *)&local_60,(_Base_ptr)pVar16.first._M_node);
            }
          }
          local_b0._M_node._0_4_ = *(uint *)(lVar9 + 8);
          if (local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      (&local_88,
                       (iterator)
                       local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_b0);
          }
          else {
            *local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish = *(uint *)(lVar9 + 8);
            local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
        }
      } while (local_60._M_impl.super__Rb_tree_header._M_node_count != 0);
    }
    this_00 = (vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>>>
               *)(pCVar13 + 0x78);
    puVar15 = *(uint **)local_90 + 1;
    if (puVar15 != *(uint **)(local_90 + 8)) {
      lVar9 = (ulong)**(uint **)local_90 * 0x30;
      do {
        lVar10 = *(long *)this_00;
        targetColumn = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>
                        *)(lVar10 + lVar9);
        uVar1 = *(uint *)(lVar10 + 4 + lVar9);
        source = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>
                  *)((ulong)*puVar15 * 0x30 + lVar10);
        local_b0._M_node = (_List_node_base *)targetColumn;
        bVar8 = _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>const&,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persist___ue,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>__Matrix_column_tag_1u>_false>___1_>
                          (source,targetColumn,(anon_class_1_0_00000001 *)&local_a8,
                           (anon_class_8_1_e4bd5e45 *)&local_b0,&local_99,&local_9a,&local_9b);
        if (bVar8) {
          IVar2 = (targetColumn->super_Chain_column_option).pivot_;
          (targetColumn->super_Chain_column_option).pivot_ =
               (source->super_Chain_column_option).pivot_;
          (source->super_Chain_column_option).pivot_ = IVar2;
          DVar3 = (targetColumn->super_Column_dimension_option).dim_;
          (targetColumn->super_Column_dimension_option).dim_ =
               (source->super_Column_dimension_option).dim_;
          (source->super_Column_dimension_option).dim_ = DVar3;
        }
        uVar4 = (targetColumn->super_Chain_column_option).pivot_;
        if (uVar1 != uVar4) {
          lVar10 = *(long *)(local_98 + 0x90);
          uVar5 = *(undefined4 *)(lVar10 + (ulong)uVar1 * 4);
          *(undefined4 *)(lVar10 + (ulong)uVar1 * 4) = *(undefined4 *)(lVar10 + (ulong)uVar4 * 4);
          *(undefined4 *)(lVar10 + (ulong)uVar4 * 4) = uVar5;
        }
        puVar15 = puVar15 + 1;
      } while (puVar15 != *(uint **)(local_90 + 8));
    }
    local_a8 = local_a0;
    std::
    _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
    ::_M_insert_unique<unsigned_int_const&>
              ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                *)&local_60,&local_a8);
    local_68 = (Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>
                *)local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish;
    if (local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pCVar13 = (Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>
                 *)local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start;
      do {
        puVar14 = (undefined8 *)(*(long *)this_00 + (ulong)*(uint *)pCVar13 * 0x30 + 0x20);
        for (puVar12 = (undefined8 *)*puVar14; puVar12 != puVar14; puVar12 = (undefined8 *)*puVar12)
        {
          if (puVar12 == (undefined8 *)0x0) {
LAB_00115b89:
            __assert_fail("!!p","/usr/include/boost/intrusive/detail/hook_traits.hpp",0x3e,
                          "static pointer boost::intrusive::bhtraits_base<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<true, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, false, false, true>>>, boost::intrusive::list_node<void *> *, Gudhi::persistence_matrix::Matrix<Chain_barcode_options<true, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, false, false, true>>::Matrix_column_tag, 1>::to_value_ptr(const node_ptr &) [T = Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<true, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, false, false, true>>>, NodePtr = boost::intrusive::list_node<void *> *, Tag = Gudhi::persistence_matrix::Matrix<Chain_barcode_options<true, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, false, false, true>>::Matrix_column_tag, Type = 1]"
                         );
          }
          local_b0._M_node._0_4_ = *(undefined4 *)(puVar12 + 2);
          pVar16 = std::
                   _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                   ::_M_insert_unique<unsigned_int>(&local_60,(uint *)&local_b0);
          if (((undefined1  [16])pVar16 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            std::
            _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
            ::erase_abi_cxx11_((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                                *)&local_60,(_Base_ptr)pVar16.first._M_node);
          }
        }
        pCVar13 = pCVar13 + 4;
      } while (pCVar13 != local_68);
    }
    this = local_98;
    uVar1 = **(uint **)local_90;
    uVar5 = *(undefined4 *)(local_98 + 0xa8);
    local_b0._M_node._0_4_ = local_a4;
    lVar9 = std::_Rb_tree_decrement(&local_60._M_impl.super__Rb_tree_header._M_header);
    uVar4 = *(uint *)(lVar9 + 0x20);
    std::
    vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>>>
    ::
    emplace_back<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>const&,int&,Gudhi::persistence_matrix::Matrix<Chain_barcode_options<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>::Column_z2_settings*&>
              (this_00,(set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                       &local_60,(int *)&local_b0,(Column_z2_settings **)(this + 0xb0));
    *(undefined4 *)(*(long *)(this + 0x90) + (ulong)uVar4 * 4) = uVar5;
    uVar4 = *(uint *)(this + 0xa8);
    lVar9 = *(long *)(this + 0x78);
    *(uint *)(lVar9 + 8 + (ulong)uVar4 * 0x30) = uVar1;
    *(uint *)(lVar9 + 8 + (ulong)uVar1 * 0x30) = uVar4;
    local_b0._M_node._0_4_ = uVar1;
    __args = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   *)(this + 0x38),(key_type *)&local_b0);
    pCVar13 = this + 0x70;
    *(undefined4 *)&__args->_M_node[1]._M_prev = *(undefined4 *)(this + 0x70);
    std::__detail::
    _Insert_base<unsigned_int,std::pair<unsigned_int_const,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>,std::allocator<std::pair<unsigned_int_const,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::
    try_emplace<unsigned_int_const&,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>&>
              ((_Insert_base<unsigned_int,std::pair<unsigned_int_const,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>,std::allocator<std::pair<unsigned_int_const,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)(this + 0x38),(const_iterator)0x0,(uint *)pCVar13,__args);
    *(uint *)pCVar13 = *(uint *)pCVar13 + 1;
  }
  *(int *)(this + 0xa8) = *(int *)(this + 0xa8) + 1;
  if ((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>
       *)local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start !=
      (Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>
       *)0x0) {
    operator_delete(local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&local_60);
  return (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_90;
}

Assistant:

inline std::vector<typename Master_matrix::Entry_representative> Chain_matrix<Master_matrix>::_reduce_boundary(
    ID_index cellID, const Boundary_range& boundary, Dimension dim)
{
  Tmp_column column(boundary.begin(), boundary.end());
  if (dim == Master_matrix::template get_null_value<Dimension>())
    dim = boundary.begin() == boundary.end() ? 0 : boundary.size() - 1;
  std::vector<Entry_representative> chainsInH;  // for corresponding indices in H (paired columns)
  std::vector<Entry_representative> chainsInF;  // for corresponding indices in F (unpaired, essential columns)

  auto get_last = [&column]() {
    if constexpr (Master_matrix::Option_list::is_z2)
      return *(column.rbegin());
    else
      return column.rbegin()->first;
  };

  if (boundary.begin() == boundary.end()) {
    if constexpr (Master_matrix::Option_list::is_z2)
      column.insert(cellID);
    else
      column.emplace(cellID, 1);
    _insert_chain(column, dim);
    return chainsInF;
  }

  Index currentIndex = get_column_with_pivot(get_last());

  while (get_column(currentIndex).is_paired()) {
    _reduce_by_G(column, chainsInH, currentIndex);

    if (column.empty()) {
      // produce the sum of all col_h in chains_in_H
      _build_from_H(cellID, column, chainsInH);
      // create a new cycle (in F) sigma - \sum col_h
      _insert_chain(column, dim);
      return chainsInF;
    }

    currentIndex = get_column_with_pivot(get_last());
  }

  while (!column.empty()) {
    currentIndex = get_column_with_pivot(get_last());

    if (!get_column(currentIndex).is_paired()) {
      // only fills currentEssentialCycleIndices if Z2 coefficients, so chainsInF remains empty
      _reduce_by_F(column, chainsInF, currentIndex);
    } else {
      _reduce_by_G(column, chainsInH, currentIndex);
    }
  }

  _update_largest_death_in_F(chainsInF);

  // Compute the new column cellID + \sum col_h, for col_h in chains_in_H
  _build_from_H(cellID, column, chainsInH);

  // Create and insert (\sum col_h) + sigma (in H, paired with chain_fp) in matrix_
  if constexpr (Master_matrix::Option_list::is_z2)
    _insert_chain(column, dim, chainsInF[0]);
  else
    _insert_chain(column, dim, chainsInF[0].first);

  return chainsInF;
}